

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getInterfaceExpr
          (PortConnectionBuilder *this,InterfacePortSymbol *port,PropertyExprSyntax *syntax,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  LookupLocation lookupLocation;
  IfaceConn ifaceConn;
  ExpressionSyntax *pEVar1;
  type *ptVar2;
  ModportSymbol *pMVar3;
  Expression *in_RCX;
  bitmask<slang::ast::ASTFlags> in_RDI;
  InterfacePortSymbol *in_R8;
  type *connExpr;
  type *conn;
  ExpressionSyntax *expr;
  ASTContext context;
  ExpressionSyntax *in_stack_00000318;
  InterfacePortSymbol *in_stack_00000320;
  ASTContext *in_stack_00000328;
  PortConnectionBuilder *in_stack_00000330;
  InterfacePortSymbol *in_stack_ffffffffffffff08;
  PortConnectionBuilder *in_stack_ffffffffffffff10;
  ASTContext *in_stack_ffffffffffffff18;
  Scope *pSVar4;
  undefined8 in_stack_ffffffffffffff30;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> in_stack_ffffffffffffff60;
  bitmask<slang::ast::ASTFlags> local_80;
  undefined8 local_78;
  undefined8 local_70;
  Expression *local_18;
  InterfacePortSymbol *local_10;
  PortConnection *local_8;
  
  pSVar4 = *(Scope **)in_RDI.m_bits;
  local_78 = *(undefined8 *)(in_RDI.m_bits + 0x18);
  local_70 = *(undefined8 *)(in_RDI.m_bits + 0x20);
  local_18 = in_RCX;
  local_10 = in_R8;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_80,NonProcedural);
  lookupLocation._8_8_ = in_stack_ffffffffffffff30;
  lookupLocation.scope = pSVar4;
  ASTContext::ASTContext
            (in_stack_ffffffffffffff18,(Scope *)in_stack_ffffffffffffff10,lookupLocation,in_RDI);
  pEVar1 = ASTContext::requireSimpleExpr
                     ((ASTContext *)in_stack_ffffffffffffff10,
                      (PropertyExprSyntax *)in_stack_ffffffffffffff08);
  if (pEVar1 == (ExpressionSyntax *)0x0) {
    local_8 = emptyConnection(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    getInterfaceConn(in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318);
    ptVar2 = std::
             get<0ul,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>,slang::ast::Expression_const*>
                       ((pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
                         *)0x476250);
    pMVar3 = (ModportSymbol *)
             std::
             get<1ul,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>,slang::ast::Expression_const*>
                       ((pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
                         *)0x47625f);
    ifaceConn.second = pMVar3;
    ifaceConn.first = &ptVar2->second->super_Symbol;
    local_8 = createConnection((PortConnectionBuilder *)ptVar2->first,local_10,ifaceConn,local_18,
                               in_stack_ffffffffffffff60);
  }
  return local_8;
}

Assistant:

PortConnection* getInterfaceExpr(const InterfacePortSymbol& port,
                                     const PropertyExprSyntax& syntax,
                                     std::span<const AttributeSymbol* const> attributes) {
        ASTContext context(scope, lookupLocation, ASTFlags::NonProcedural);
        auto expr = context.requireSimpleExpr(syntax);
        if (!expr)
            return emptyConnection(port);

        auto [conn, connExpr] = getInterfaceConn(context, port, *expr);
        return createConnection(port, conn, connExpr, attributes);
    }